

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::DescriptorScriptPubKeyMan::UpgradeDescriptorCache(DescriptorScriptPubKeyMan *this)

{
  DescriptorCache *this_00;
  long lVar1;
  WalletStorage *pWVar2;
  element_type *peVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  runtime_error *prVar8;
  long in_FS_OFFSET;
  allocator<char> local_3d9;
  DescriptorCache diff;
  DescriptorCache temp_cache;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  FlatSigningProvider out_keys;
  FlatSigningProvider provider;
  undefined4 extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock79,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xabc,false);
  iVar6 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[10])();
  if ((char)iVar6 == '\0') {
    pWVar2 = (this->super_ScriptPubKeyMan).m_storage;
    iVar6 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,4);
    if ((char)iVar6 == '\0') {
      this_00 = &(this->m_wallet_descriptor).cache;
      DescriptorCache::GetCachedLastHardenedExtPubKeys((ExtPubKeyMap *)&provider,this_00);
      p_Var4 = provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&provider);
      if (p_Var4 == (_Base_ptr)0x0) {
        provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
        provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&PTR__FlatSigningProvider_00a2aa40;
        provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
        provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
        provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
        provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
        provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 *)&out_keys,this);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::operator=(&provider.keys._M_t,
                    (_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                     *)&out_keys);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                     *)&out_keys);
        out_keys.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&PTR__FlatSigningProvider_00a2aa40;
        out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
        out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
        out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header;
        out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header;
        out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
        out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        temp_cache.m_derived_xpubs._M_h._M_buckets =
             &temp_cache.m_derived_xpubs._M_h._M_single_bucket;
        temp_cache.m_derived_xpubs._M_h._M_bucket_count = 1;
        temp_cache.m_derived_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        temp_cache.m_derived_xpubs._M_h._M_element_count = 0;
        temp_cache.m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        temp_cache.m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
        temp_cache.m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        temp_cache.m_parent_xpubs._M_h._M_buckets = &temp_cache.m_parent_xpubs._M_h._M_single_bucket
        ;
        temp_cache.m_parent_xpubs._M_h._M_bucket_count = 1;
        temp_cache.m_parent_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        temp_cache.m_parent_xpubs._M_h._M_element_count = 0;
        temp_cache.m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        temp_cache.m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
        temp_cache.m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        temp_cache.m_last_hardened_xpubs._M_h._M_buckets =
             &temp_cache.m_last_hardened_xpubs._M_h._M_single_bucket;
        temp_cache.m_last_hardened_xpubs._M_h._M_bucket_count = 1;
        temp_cache.m_last_hardened_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        temp_cache.m_last_hardened_xpubs._M_h._M_element_count = 0;
        temp_cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        temp_cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
        temp_cache.m_last_hardened_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        peVar3 = (this->m_wallet_descriptor).descriptor.
                 super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar6 = (*peVar3->_vptr_Descriptor[8])(peVar3,0,&provider,&scripts_temp,&out_keys);
        if ((char)iVar6 == '\0') {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"Unable to expand descriptor");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00434756;
        }
        DescriptorCache::MergeAndDiff(&diff,this_00,&temp_cache);
        iVar6 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
        plVar7 = (long *)CONCAT44(extraout_var,iVar6);
        (**(code **)(*plVar7 + 0x70))(&local_260,plVar7,1);
        local_260._M_string_length = (size_type)plVar7;
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_240,this);
        bVar5 = WalletBatch::WriteDescriptorCacheItems
                          ((WalletBatch *)&local_260,(uint256 *)&local_240,&diff);
        if ((long *)local_260._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_260._M_dataplus._M_p + 0x28))();
        }
        if (!bVar5) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,"UpgradeDescriptorCache",&local_3d9);
          std::operator+(&local_240,&local_260,": writing cache items failed");
          std::runtime_error::runtime_error(prVar8,(string *)&local_240);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00434756;
        }
        DescriptorCache::~DescriptorCache(&diff);
        DescriptorCache::~DescriptorCache(&temp_cache);
        std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts_temp);
        FlatSigningProvider::~FlatSigningProvider(&out_keys);
        FlatSigningProvider::~FlatSigningProvider(&provider);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock79.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00434756:
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::UpgradeDescriptorCache()
{
    LOCK(cs_desc_man);
    if (m_storage.IsLocked() || m_storage.IsWalletFlagSet(WALLET_FLAG_LAST_HARDENED_XPUB_CACHED)) {
        return;
    }

    // Skip if we have the last hardened xpub cache
    if (m_wallet_descriptor.cache.GetCachedLastHardenedExtPubKeys().size() > 0) {
        return;
    }

    // Expand the descriptor
    FlatSigningProvider provider;
    provider.keys = GetKeys();
    FlatSigningProvider out_keys;
    std::vector<CScript> scripts_temp;
    DescriptorCache temp_cache;
    if (!m_wallet_descriptor.descriptor->Expand(0, provider, scripts_temp, out_keys, &temp_cache)){
        throw std::runtime_error("Unable to expand descriptor");
    }

    // Cache the last hardened xpubs
    DescriptorCache diff = m_wallet_descriptor.cache.MergeAndDiff(temp_cache);
    if (!WalletBatch(m_storage.GetDatabase()).WriteDescriptorCacheItems(GetID(), diff)) {
        throw std::runtime_error(std::string(__func__) + ": writing cache items failed");
    }
}